

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
InsertUnique(InnerMap *this,size_type b,Node *node)

{
  bool bVar1;
  unsigned_long *puVar2;
  long in_RSI;
  iterator *in_RDI;
  iterator result;
  size_type in_stack_fffffffffffffe58;
  InnerMap *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  InnerMap *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffec8;
  InnerMap *in_stack_fffffffffffffed0;
  Node *local_120;
  InnerMap *local_118;
  size_type local_110;
  Node *local_108;
  InnerMap *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  InnerMap *in_stack_ffffffffffffff10;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_80;
  size_type in_stack_ffffffffffffffa8;
  InnerMap *in_stack_ffffffffffffffb0;
  
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::iterator_base(&local_80);
  bVar1 = TableEntryIsEmpty(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (bVar1) {
    InsertUniqueInList(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                       (Node *)in_stack_fffffffffffffe60);
    local_80.node_ = local_108;
    local_80.m_ = in_stack_ffffffffffffff00;
    local_80.bucket_index_ = in_stack_ffffffffffffff08;
  }
  else {
    bVar1 = TableEntryIsNonEmptyList(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (!bVar1) {
      InsertUniqueInTree(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         (Node *)in_stack_ffffffffffffff00);
      return in_RDI;
    }
    bVar1 = TableEntryIsTooLong(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (!bVar1) {
      InsertUniqueInList(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                         (Node *)in_stack_fffffffffffffe60);
      return in_RDI;
    }
    TreeConvert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    InsertUniqueInTree(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       (Node *)in_stack_ffffffffffffff00);
    local_80.node_ = local_120;
    local_80.m_ = local_118;
    local_80.bucket_index_ = local_110;
  }
  puVar2 = std::min<unsigned_long>((unsigned_long *)(in_RSI + 0x18),&local_80.bucket_index_);
  *(unsigned_long *)(in_RSI + 0x18) = *puVar2;
  in_RDI->node_ = local_80.node_;
  in_RDI->m_ = local_80.m_;
  in_RDI->bucket_index_ = local_80.bucket_index_;
  return in_RDI;
}

Assistant:

iterator InsertUnique(size_type b, Node* node) {
      GOOGLE_DCHECK(index_of_first_non_null_ == num_buckets_ ||
             table_[index_of_first_non_null_] != NULL);
      // In practice, the code that led to this point may have already
      // determined whether we are inserting into an empty list, a short list,
      // or whatever.  But it's probably cheap enough to recompute that here;
      // it's likely that we're inserting into an empty or short list.
      iterator result;
      GOOGLE_DCHECK(find(*KeyPtrFromNodePtr(node)) == end());
      if (TableEntryIsEmpty(b)) {
        result = InsertUniqueInList(b, node);
      } else if (TableEntryIsNonEmptyList(b)) {
        if (PROTOBUF_PREDICT_FALSE(TableEntryIsTooLong(b))) {
          TreeConvert(b);
          result = InsertUniqueInTree(b, node);
          GOOGLE_DCHECK_EQ(result.bucket_index_, b & ~static_cast<size_type>(1));
        } else {
          // Insert into a pre-existing list.  This case cannot modify
          // index_of_first_non_null_, so we skip the code to update it.
          return InsertUniqueInList(b, node);
        }
      } else {
        // Insert into a pre-existing tree.  This case cannot modify
        // index_of_first_non_null_, so we skip the code to update it.
        return InsertUniqueInTree(b, node);
      }
      // parentheses around (std::min) prevents macro expansion of min(...)
      index_of_first_non_null_ =
          (std::min)(index_of_first_non_null_, result.bucket_index_);
      return result;
    }